

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int eaten_stat(int base,obj *obj)

{
  ushort uVar1;
  int local_3c;
  int local_38;
  ulong local_30;
  long full_amount;
  long uneaten_amt;
  obj *obj_local;
  int base_local;
  
  full_amount = (long)obj->oeaten;
  if (obj->otyp == 0x10e) {
    uVar1 = mons[obj->corpsenm].cnutrit;
  }
  else {
    uVar1 = objects[obj->otyp].oc_nutrition;
  }
  local_30 = (ulong)uVar1;
  if (local_30 < (ulong)full_amount) {
    warning("partly eaten food (%ld) more nutritious than untouched food (%ld)",full_amount,local_30
           );
    full_amount = local_30;
  }
  if (local_30 == 0) {
    local_38 = 0;
  }
  else {
    local_38 = (int)((base * full_amount) / (long)local_30);
  }
  local_3c = local_38;
  if (local_38 < 1) {
    local_3c = 1;
  }
  return local_3c;
}

Assistant:

int eaten_stat(int base, struct obj *obj)
{
	long uneaten_amt, full_amount;

	uneaten_amt = (long)obj->oeaten;
	full_amount = (obj->otyp == CORPSE) ? (long)mons[obj->corpsenm].cnutrit
					: (long)objects[obj->otyp].oc_nutrition;
	if (uneaten_amt > full_amount) {
	    warning(
	  "partly eaten food (%ld) more nutritious than untouched food (%ld)",
		       uneaten_amt, full_amount);
	    uneaten_amt = full_amount;
	}

	base = (int)(full_amount ? (long)base * uneaten_amt / full_amount : 0L);
	return (base < 1) ? 1 : base;
}